

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O2

size_t sylvan_serialize_assign_rec(BDD bdd)

{
  uint8_t *puVar1;
  size_t sVar2;
  sylvan_ser *root;
  sylvan_ser *data;
  long lVar3;
  sylvan_ser s;
  sylvan_ser local_30;
  
  local_30.bdd = bdd & 0x7fffffffffffffff;
  if (local_30.bdd != 0) {
    puVar1 = nodes->data;
    root = sylvan_ser_search(sylvan_ser_set,&local_30);
    if (root == (sylvan_ser *)0x0) {
      data = &local_30;
      local_30.assigned = 0;
      lVar3 = (bdd & 0xffffffffff) * 0x10;
      root = sylvan_ser_put(&sylvan_ser_set,data,(int *)0x0);
      sylvan_serialize_assign_rec(*(ulong *)(puVar1 + lVar3 + 8) & 0xffffffffff);
      sylvan_serialize_assign_rec(*(ulong *)(puVar1 + lVar3) & 0x800000ffffffffff);
      sVar2 = sylvan_ser_counter + 1;
      root->assigned = sylvan_ser_counter;
      sylvan_ser_counter = sVar2;
      sylvan_ser_reversed_insert((avl_node_t **)root,data);
    }
    return root->assigned;
  }
  return 0;
}

Assistant:

static size_t
sylvan_serialize_assign_rec(BDD bdd)
{
    if (sylvan_isnode(bdd)) {
        bddnode_t n = MTBDD_GETNODE(bdd);

        struct sylvan_ser s, *ss;
        s.bdd = BDD_STRIPMARK(bdd);
        ss = sylvan_ser_search(sylvan_ser_set, &s);
        if (ss == NULL) {
            // assign dummy value
            s.assigned = 0;
            ss = sylvan_ser_put(&sylvan_ser_set, &s, NULL);

            // first assign recursively
            sylvan_serialize_assign_rec(bddnode_getlow(n));
            sylvan_serialize_assign_rec(bddnode_gethigh(n));

            // assign real value
            ss->assigned = sylvan_ser_counter++;

            // put a copy in the reversed table
            sylvan_ser_reversed_insert(&sylvan_ser_reversed_set, ss);
        }

        return ss->assigned;
    }

    return BDD_STRIPMARK(bdd);
}